

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

int64_t read_sleb128(dwarf_buf *buf)

{
  byte bVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar6 = 0;
  uVar7 = 0;
  bVar3 = false;
  do {
    pbVar2 = buf->buf;
    iVar4 = advance(buf,1);
    if (iVar4 == 0) {
      return 0;
    }
    bVar1 = *pbVar2;
    if (uVar7 < 0x40) {
      uVar6 = uVar6 | (ulong)(bVar1 & 0x7f) << ((byte)uVar7 & 0x3f);
    }
    else {
      if (!bVar3) {
        dwarf_buf_error(buf,"signed LEB128 overflows uint64_t",0);
      }
      bVar3 = true;
    }
    uVar7 = uVar7 + 7;
  } while ((char)bVar1 < '\0');
  uVar5 = -1L << ((byte)uVar7 & 0x3f);
  if (0x3f < uVar7) {
    uVar5 = 0;
  }
  if (bVar1 < 0x40) {
    uVar5 = 0;
  }
  return uVar6 | uVar5;
}

Assistant:

static int64_t
read_sleb128 (struct dwarf_buf *buf)
{
  uint64_t val;
  unsigned int shift;
  int overflow;
  unsigned char b;

  val = 0;
  shift = 0;
  overflow = 0;
  do
    {
      const unsigned char *p;

      p = buf->buf;
      if (!advance (buf, 1))
	return 0;
      b = *p;
      if (shift < 64)
	val |= ((uint64_t) (b & 0x7f)) << shift;
      else if (!overflow)
	{
	  dwarf_buf_error (buf, "signed LEB128 overflows uint64_t", 0);
	  overflow = 1;
	}
      shift += 7;
    }
  while ((b & 0x80) != 0);

  if ((b & 0x40) != 0 && shift < 64)
    val |= ((uint64_t) -1) << shift;

  return (int64_t) val;
}